

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

char * __thiscall
Memory::LargeHeapBlock::TryAllocFromFreeList
          (LargeHeapBlock *this,size_t size,ObjectInfoBits attributes)

{
  LargeHeapBlockFreeListEntry **ppLVar1;
  undefined4 *puVar2;
  LargeHeapBlockFreeListEntry *entry;
  LargeHeapBlockFreeListEntry *pLVar3;
  code *pcVar4;
  LargeHeapBlockFreeListEntry **ppLVar5;
  bool bVar6;
  char *pcVar7;
  LargeHeapBlockFreeListEntry **ppLVar8;
  undefined8 *in_FS_OFFSET;
  
  if (InternalObjectInfoBitMask < attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x1dd,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar6) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar2 = 0;
  }
  ppLVar1 = &(this->freeList).entries;
  ppLVar5 = ppLVar1;
  do {
    do {
      ppLVar8 = ppLVar5;
      entry = *ppLVar8;
      if (entry == (LargeHeapBlockFreeListEntry *)0x0) {
        pcVar7 = (char *)0x0;
        goto LAB_00266d56;
      }
      ppLVar5 = &entry->next;
    } while (entry->objectSize < size);
    pLVar3 = entry->next;
    pcVar7 = AllocFreeListEntry(entry->heapBlock,size,attributes,entry);
  } while (pcVar7 == (char *)0x0);
  *ppLVar8 = pLVar3;
LAB_00266d56:
  if (*ppLVar1 == (LargeHeapBlockFreeListEntry *)0x0) {
    LargeHeapBucket::UnregisterFreeList(this->bucket,&this->freeList);
  }
  return pcVar7;
}

Assistant:

char*
LargeHeapBlock::TryAllocFromFreeList(DECLSPEC_GUARD_OVERFLOW size_t size, ObjectInfoBits attributes)
{
    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    LargeHeapBlockFreeListEntry** prev = &this->freeList.entries;
    LargeHeapBlockFreeListEntry* freeListEntry = this->freeList.entries;

    char* memBlock = nullptr;

    // Walk through the free list, find the first entry that can fit our desired size
    while (freeListEntry)
    {
        LargeHeapBlockFreeListEntry* next = freeListEntry->next;
        LargeHeapBlock* heapBlock = freeListEntry->heapBlock;

        if (freeListEntry->objectSize >= size)
        {
            memBlock = heapBlock->AllocFreeListEntry(size, attributes, freeListEntry);
            if (memBlock)
            {
                (*prev) = next;

                break;
            }
        }

        prev = &freeListEntry->next;
        freeListEntry = freeListEntry->next;
    }

    if (this->freeList.entries == nullptr)
    {
        this->bucket->UnregisterFreeList(&this->freeList);
    }

    return memBlock;
}